

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readandsynthesis.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  uint f0_length;
  int fs;
  int iVar3;
  double *f0;
  double *temporal_positions;
  double **spectrogram;
  double **aperiodicity;
  double *pdVar4;
  double **ppdVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  char filename [200];
  
  iVar2 = 0;
  if (1 < argc) {
    pcVar1 = argv[1];
    iVar2 = strcmp(pcVar1,"-h");
    if (iVar2 == 0) {
      anon_unknown.dwarf_11a::usage(*argv);
      iVar2 = -1;
    }
    else {
      dVar10 = GetHeaderInformation(pcVar1,"NOF ");
      f0_length = (uint)dVar10;
      dVar10 = GetHeaderInformation(argv[2],"FFT ");
      iVar2 = (int)dVar10;
      dVar10 = GetHeaderInformation(argv[2],"FS  ");
      fs = (int)dVar10;
      dVar10 = GetHeaderInformation(argv[2],"FP  ");
      memcpy(filename,"output.wav",200);
      uVar7 = (ulong)(uint)argc;
      do {
        uVar8 = uVar7 - 1;
        if (uVar8 == 0) goto LAB_001013f0;
        iVar3 = strcmp(argv[uVar8],"-o");
        if (iVar3 == 0) {
          snprintf(filename,200,argv[uVar7]);
        }
        iVar3 = strcmp(argv[uVar8],"-h");
        uVar7 = uVar8;
      } while (iVar3 != 0);
      anon_unknown.dwarf_11a::usage(*argv);
      if (uVar8 == 0) {
LAB_001013f0:
        uVar7 = (long)(int)f0_length * 8;
        if ((int)f0_length < 0) {
          uVar7 = 0xffffffffffffffff;
        }
        f0 = (double *)operator_new__(uVar7);
        temporal_positions = (double *)operator_new__(uVar7);
        spectrogram = (double **)operator_new__(uVar7);
        aperiodicity = (double **)operator_new__(uVar7);
        uVar8 = (ulong)f0_length;
        if (0 < (int)f0_length) {
          uVar6 = (long)(iVar2 / 2) * 8 + 8;
          if (iVar2 < -3) {
            uVar6 = 0xffffffffffffffff;
          }
          uVar9 = 0;
          do {
            pdVar4 = (double *)operator_new__(uVar6);
            spectrogram[uVar9] = pdVar4;
            pdVar4 = (double *)operator_new__(uVar6);
            aperiodicity[uVar9] = pdVar4;
            uVar9 = uVar9 + 1;
          } while (uVar8 != uVar9);
        }
        ReadF0(argv[1],temporal_positions,f0);
        dVar11 = GetHeaderInformation(argv[2],"NOD ");
        iVar3 = (int)dVar11;
        pcVar1 = argv[2];
        if (iVar3 == 0) {
          ReadSpectralEnvelope(pcVar1,spectrogram);
        }
        else {
          ppdVar5 = (double **)operator_new__(uVar7);
          if ((int)f0_length < 1) {
            ReadSpectralEnvelope(pcVar1,ppdVar5);
            DecodeSpectralEnvelope(ppdVar5,f0_length,fs,iVar2,iVar3,spectrogram);
          }
          else {
            uVar6 = 0xffffffffffffffff;
            if (-1 < iVar3) {
              uVar6 = (long)iVar3 << 3;
            }
            uVar9 = 0;
            do {
              pdVar4 = (double *)operator_new__(uVar6);
              ppdVar5[uVar9] = pdVar4;
              uVar9 = uVar9 + 1;
            } while (uVar8 != uVar9);
            ReadSpectralEnvelope(pcVar1,ppdVar5);
            DecodeSpectralEnvelope(ppdVar5,f0_length,fs,iVar2,iVar3,spectrogram);
            if (0 < (int)f0_length) {
              uVar6 = 0;
              do {
                if (ppdVar5[uVar6] != (double *)0x0) {
                  operator_delete__(ppdVar5[uVar6]);
                }
                uVar6 = uVar6 + 1;
              } while (uVar8 != uVar6);
            }
          }
          operator_delete__(ppdVar5);
        }
        dVar11 = GetHeaderInformation(argv[3],"NOD ");
        iVar3 = (int)dVar11;
        pcVar1 = argv[3];
        if (iVar3 == 0) {
          ReadAperiodicity(pcVar1,aperiodicity);
        }
        else {
          ppdVar5 = (double **)operator_new__(uVar7);
          if ((int)f0_length < 1) {
            ReadAperiodicity(pcVar1,ppdVar5);
            DecodeAperiodicity(ppdVar5,f0_length,fs,iVar2,aperiodicity);
          }
          else {
            uVar7 = 0xffffffffffffffff;
            if (-1 < iVar3) {
              uVar7 = (long)iVar3 << 3;
            }
            uVar6 = 0;
            do {
              pdVar4 = (double *)operator_new__(uVar7);
              ppdVar5[uVar6] = pdVar4;
              uVar6 = uVar6 + 1;
            } while (uVar8 != uVar6);
            ReadAperiodicity(pcVar1,ppdVar5);
            DecodeAperiodicity(ppdVar5,f0_length,fs,iVar2,aperiodicity);
            if (0 < (int)f0_length) {
              uVar7 = 0;
              do {
                if (ppdVar5[uVar7] != (double *)0x0) {
                  operator_delete__(ppdVar5[uVar7]);
                }
                uVar7 = uVar7 + 1;
              } while (uVar8 != uVar7);
            }
          }
          operator_delete__(ppdVar5);
        }
        iVar3 = (int)((double)fs * ((dVar10 * (double)(int)f0_length) / 1000.0));
        uVar7 = 0xffffffffffffffff;
        if (-1 < iVar3) {
          uVar7 = (long)iVar3 * 8;
        }
        pdVar4 = (double *)operator_new__(uVar7);
        Synthesis(f0,f0_length,spectrogram,aperiodicity,iVar2,dVar10,fs,iVar3,pdVar4);
        wavwrite(pdVar4,iVar3,fs,0x10,filename);
        operator_delete__(pdVar4);
        if (0 < (int)f0_length) {
          uVar7 = 0;
          do {
            if (spectrogram[uVar7] != (double *)0x0) {
              operator_delete__(spectrogram[uVar7]);
            }
            if (aperiodicity[uVar7] != (double *)0x0) {
              operator_delete__(aperiodicity[uVar7]);
            }
            uVar7 = uVar7 + 1;
          } while (uVar8 != uVar7);
        }
        operator_delete__(spectrogram);
        operator_delete__(aperiodicity);
        operator_delete__(f0);
        operator_delete__(temporal_positions);
      }
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int main(int argc, char **argv) {
  // Command check
  if (argc < 2) return 0;
  if (0 == strcmp(argv[1], "-h")) {
    usage(argv[0]);
    return -1;
  }

  // Get parameters required for memory allocation
  int f0_length = static_cast<int>(GetHeaderInformation(argv[1], "NOF "));
  int fft_size = static_cast<int>(GetHeaderInformation(argv[2], "FFT "));
  int fs = static_cast<int>(GetHeaderInformation(argv[2], "FS  "));
  double frame_period = GetHeaderInformation(argv[2], "FP  ");
  char filename[200] = "output.wav";

  // Option from command line
  if (SetOption(argc, argv, filename) == 0) return 0;

  // Memory allocation
  double *f0 = new double[f0_length];
  double *temporal_positions = new double[f0_length];
  double **spectrogram = new double *[f0_length];
  double **aperiodicity = new double *[f0_length];
  for (int i = 0; i < f0_length; ++i) {
    spectrogram[i] = new double[fft_size / 2 + 1];
    aperiodicity[i] = new double[fft_size / 2 + 1];
  }

  // Read F0
  ReadF0(argv[1], temporal_positions, f0);

  // Read spectral envelope
  int number_of_dimensions =
    static_cast<int>(GetHeaderInformation(argv[2], "NOD "));
  if (number_of_dimensions == 0) {
    // If the spectral envelope is not coded.
    ReadSpectralEnvelope(argv[2], spectrogram);
  } else {
    // If the spectral envelope is coded.
    ReadCodedSpectralEnvelope(argv[2], f0_length, fs, fft_size,
      number_of_dimensions, spectrogram);
  }

  // Read aperiodicity
  number_of_dimensions =
    static_cast<int>(GetHeaderInformation(argv[3], "NOD "));
  if (number_of_dimensions == 0) {
    // If the aperiodicity is not coded.
    ReadAperiodicity(argv[3], aperiodicity);
  } else {
    // If the aperiodicity is coded.
    ReadCodedAperiodicity(argv[3], f0_length, fs, fft_size,
        number_of_dimensions, aperiodicity);
  }

  // Synthesis
  int y_length = static_cast<int>(f0_length * frame_period / 1000.0 * fs);
  double *y = new double[y_length];
  Synthesis(f0, f0_length, spectrogram, aperiodicity, fft_size, frame_period,
      fs, y_length, y);

  // File output
  wavwrite(y, y_length, fs, 16, filename);

  // Memory deallocation
  delete[] y;
  for (int i = 0; i < f0_length; ++i) {
    delete[] spectrogram[i];
    delete[] aperiodicity[i];
  }
  delete[] spectrogram;
  delete[] aperiodicity;
  delete[] f0;
  delete[] temporal_positions;
  return 0;
}